

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

VRDatumPtr MinVR::CreateVRDatumInt(void *pData)

{
  VRDatumPtrRC *extraout_RDX;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar1;
  VRDatumInt *obj;
  VRInt in_stack_ffffffffffffffbc;
  VRDatum_conflict *this;
  VRDatum *in_stack_ffffffffffffffd8;
  VRDatumPtr *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  operator_new(0x68);
  VRDatumInt::VRDatumInt((VRDatumInt *)this,in_stack_ffffffffffffffbc);
  VRDatumPtr::VRDatumPtr(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  VVar1.reference = extraout_RDX;
  VVar1.pData = in_RDI;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumInt(void *pData) {
  VRDatumInt *obj = new VRDatumInt(*static_cast<VRInt *>(pData));
  return VRDatumPtr(obj);
}